

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedPart.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::ArticulatedPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ArticulatedPart *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Articulation Parameters:",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tParameter Change:     ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAttachement ID:       ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tType Metric:          ",0x18);
  ENUMS::GetEnumAsStringArticulatedPartsMetric_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)(this->m_ui32ParamTypeVariant & 0x1f),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tType High Bits:       ",0x18);
  ENUMS::GetEnumAsStringArticulatedPartsClass_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(this->m_ui32ParamTypeVariant & 0xffffffe0),Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tValue:                ",0x18);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32ParamValue);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString ArticulatedPart::GetAsString() const
{
    KStringStream ss;

    ss << "Articulation Parameters:"
       << "\n\tParameter Change:     " << ( KUINT16 )m_ui8ParmeterChange
       << "\n\tAttachement ID:       " << m_ui16AttachementID
       << "\n\tType Metric:          " << GetEnumAsStringArticulatedPartsMetric( GetTypeVariantMetric() )
       << "\n\tType High Bits:       " << GetEnumAsStringArticulatedPartsClass( GetTypeVariantClass() )
       << "\n\tValue:                " << m_f32ParamValue
       << "\n";

    return ss.str();
}